

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O0

Symbol * sym_AddMacro(char *symName,int32_t defLineNo,char *body,size_t size)

{
  Symbol *sym;
  size_t size_local;
  char *body_local;
  int32_t defLineNo_local;
  char *symName_local;
  
  symName_local = createNonrelocSymbol(symName,false)->name;
  if ((Symbol *)symName_local == (Symbol *)0x0) {
    symName_local = (char *)0x0;
  }
  else {
    ((Symbol *)symName_local)->type = SYM_MACRO;
    (((Symbol *)symName_local)->field_8).field_2.macroSize = size;
    (((Symbol *)symName_local)->field_8).field_2.macro = body;
    setSymbolFilename((Symbol *)symName_local);
    ((Symbol *)symName_local)->fileLine = defLineNo;
  }
  return (Symbol *)symName_local;
}

Assistant:

struct Symbol *sym_AddMacro(char const *symName, int32_t defLineNo, char *body, size_t size)
{
	struct Symbol *sym = createNonrelocSymbol(symName, false);

	if (!sym)
		return NULL;

	sym->type = SYM_MACRO;
	sym->macroSize = size;
	sym->macro = body;
	setSymbolFilename(sym); // TODO: is this really necessary?
	// The symbol is created at the line after the `endm`,
	// override this with the actual definition line
	sym->fileLine = defLineNo;

	return sym;
}